

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::parser::expect(parser *this,token_type t)

{
  int iVar1;
  invalid_argument *this_00;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string error_msg;
  allocator *__rhs;
  string local_f0 [32];
  string local_d0 [8];
  lexer *in_stack_ffffffffffffff38;
  bool local_aa;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [20];
  token_type in_stack_ffffffffffffffac;
  allocator local_31;
  string local_30 [48];
  
  if (in_ESI != *(int *)(in_RDI + 0x28)) {
    __rhs = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"parse error - unexpected ",__rhs);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    iVar1 = *(int *)(in_RDI + 0x28);
    if (iVar1 != 0xc) {
      lexer::token_type_name(in_stack_ffffffffffffffac);
    }
    else {
      lexer::get_token_string(in_stack_ffffffffffffff38);
      std::operator+((char *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(in_RDI,(char *)__rhs);
    }
    local_aa = iVar1 == 0xc;
    std::__cxx11::string::operator+=(local_30,local_68);
    std::__cxx11::string::~string(local_68);
    if (local_aa) {
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
    }
    lexer::token_type_name(in_stack_ffffffffffffffac);
    std::operator+((char *)in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::__cxx11::string::operator+=(local_30,local_d0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,local_30);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void expect(typename lexer::token_type t) const
        {
            if (t != last_token)
            {
                std::string error_msg = "parse error - unexpected ";
                error_msg += (last_token == lexer::token_type::parse_error ? ("'" +  m_lexer.get_token_string() +
                              "'") :
                              lexer::token_type_name(last_token));
                error_msg += "; expected " + lexer::token_type_name(t);
                throw std::invalid_argument(error_msg);
            }
        }